

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

bool __thiscall QMakeProject::test(QMakeProject *this,ProKey *func,QList<ProStringList> *args)

{
  bool bVar1;
  ProFunctionDef *in_RDX;
  QMakeEvaluator *in_RSI;
  QList<ProStringList> *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar2;
  char16_t *str;
  ConstIterator it;
  const_iterator adef;
  ProStringList *in_stack_000003d0;
  ProKey *in_stack_000003d8;
  QMakeBuiltin *in_stack_000003e0;
  QMakeEvaluator *in_stack_000003e8;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  const_iterator *in_stack_fffffffffffffeb0;
  QMakeEvaluator *this_00;
  const_iterator *in_stack_fffffffffffffeb8;
  int fieldWidth;
  QStringView *this_01;
  QStringView *in_stack_fffffffffffffec8;
  ProString *in_stack_fffffffffffffed0;
  bool local_101;
  QChar fillChar;
  qsizetype local_e0;
  storage_type_conflict *local_d8;
  QChar local_ca;
  qsizetype local_c8;
  storage_type_conflict *local_c0;
  undefined1 local_b8 [88];
  piter local_60;
  piter local_38;
  piter local_28;
  QStringView local_18;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  QMakeEvaluator::Location::clear((Location *)&(in_RDI->d).size);
  local_28.bucket = 0xaaaaaaaaaaaaaaaa;
  local_28.d = (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0xaaaaaaaaaaaaaaaa;
  local_28 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constFind
                              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)
                               in_stack_fffffffffffffeb0,
                               (ProKey *)
                               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  local_38 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constEnd
                              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)
                               in_stack_fffffffffffffeb8);
  bVar1 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::const_iterator::operator!=
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (bVar1) {
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::const_iterator::operator*
              ((const_iterator *)0x32cdbf);
    prepareBuiltinArgs(in_RDI);
    QMakeEvaluator::evaluateBuiltinConditional
              (in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
    local_101 = boolRet(ReturnFalse);
    ProStringList::~ProStringList((ProStringList *)0x32ce16);
  }
  else {
    local_60.bucket = 0xaaaaaaaaaaaaaaaa;
    local_60.d = (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0xaaaaaaaaaaaaaaaa;
    local_60 = (piter)QHash<ProKey,_ProFunctionDef>::constFind
                                ((QHash<ProKey,_ProFunctionDef> *)in_stack_fffffffffffffeb0,
                                 (ProKey *)
                                 CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    local_b8._72_16_ =
         (undefined1  [16])
         QHash<ProKey,_ProFunctionDef>::constEnd
                   ((QHash<ProKey,_ProFunctionDef> *)in_stack_fffffffffffffeb8);
    bVar1 = QHash<ProKey,_ProFunctionDef>::const_iterator::operator!=
                      ((const_iterator *)in_stack_fffffffffffffeb8,
                       (const_iterator *)in_stack_fffffffffffffeb0);
    if (bVar1) {
      QHash<ProKey,_ProFunctionDef>::const_iterator::operator*((const_iterator *)0x32cea8);
      QMakeEvaluator::evaluateBoolFunction(in_RSI,in_RDX,in_RDI,in_stack_fffffffffffffed0);
      local_101 = boolRet(ReturnFalse);
    }
    else {
      this_00 = (QMakeEvaluator *)local_b8;
      fillChar.ucs = L'\0';
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)this_00,(Data *)0x0,
                 L"\'%1\' is not a recognized test function.",0x27);
      QString::QString((QString *)this_00,
                       (DataPointer *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8))
      ;
      this_01 = &local_18;
      QStringView::QStringView<QString,_true>(this_01,(QString *)in_RSI);
      fieldWidth = (int)((ulong)in_RSI >> 0x20);
      QVar2 = QStringView::mid(in_stack_fffffffffffffec8,(qsizetype)in_RDI,
                               (qsizetype)in_stack_fffffffffffffed0);
      local_e0 = QVar2.m_size;
      local_d8 = QVar2.m_data;
      local_c8 = local_e0;
      local_c0 = local_d8;
      QChar::QChar<char16_t,_true>(&local_ca,L' ');
      QString::arg<QStringView,_true>
                ((QString *)in_stack_fffffffffffffec8,this_01,fieldWidth,fillChar);
      QMakeEvaluator::evalError
                (this_00,(QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      QString::~QString((QString *)0x32cfde);
      QString::~QString((QString *)0x32cfeb);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
      local_101 = false;
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return local_101;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeProject::test(const ProKey &func, const QList<ProStringList> &args)
{
    m_current.clear();

    auto adef = statics.functions.constFind(func);
    if (adef != statics.functions.constEnd())
        return boolRet(evaluateBuiltinConditional(*adef, func, prepareBuiltinArgs(args)));

    QHash<ProKey, ProFunctionDef>::ConstIterator it =
            m_functionDefs.testFunctions.constFind(func);
    if (it != m_functionDefs.testFunctions.constEnd())
        return boolRet(evaluateBoolFunction(*it, args, func));

    evalError(QStringLiteral("'%1' is not a recognized test function.")
              .arg(func.toQStringView()));
    return false;
}